

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O3

void __thiscall
soplex::DSVectorBase<double>::DSVectorBase(DSVectorBase<double> *this,DSVectorBase<double> *old)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  
  (this->super_SVectorBase<double>).m_elem = (Nonzero<double> *)0x0;
  (this->super_SVectorBase<double>).memsize = 0;
  (this->super_SVectorBase<double>).memused = 0;
  this->_vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
  this->theelem = (Nonzero<double> *)0x0;
  iVar2 = (old->super_SVectorBase<double>).memused;
  spx_alloc<soplex::Nonzero<double>*>(&this->theelem,iVar2);
  pNVar1 = this->theelem;
  (this->super_SVectorBase<double>).m_elem = pNVar1;
  (this->super_SVectorBase<double>).memused = 0;
  (this->super_SVectorBase<double>).memsize = iVar2;
  if (this != old) {
    iVar2 = (old->super_SVectorBase<double>).memused;
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      pNVar4 = (old->super_SVectorBase<double>).m_elem;
      iVar3 = 0;
      do {
        if ((pNVar4->val != 0.0) || (NAN(pNVar4->val))) {
          pNVar1->idx = pNVar4->idx;
          pNVar1->val = pNVar4->val;
          pNVar1 = pNVar1 + 1;
          iVar3 = iVar3 + 1;
        }
        iVar2 = iVar2 + -1;
        pNVar4 = pNVar4 + 1;
      } while (iVar2 != 0);
    }
    (this->super_SVectorBase<double>).memused = iVar3;
  }
  return;
}

Assistant:

DSVectorBase(const DSVectorBase<R>& old)
      : SVectorBase<R>()
      , theelem(nullptr)
   {
      allocMem(old.size());
      SVectorBase<R>::operator=(old);

      assert(isConsistent());
   }